

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

int cgltf_json_to_int(jsmntok_t *tok,uint8_t *json_chunk)

{
  uint uVar1;
  int iVar2;
  size_t __n;
  char tmp [128];
  
  if (tok->type == JSMN_PRIMITIVE) {
    uVar1 = tok->end - tok->start;
    __n = 0x7f;
    if (uVar1 < 0x7f) {
      __n = (size_t)uVar1;
    }
    strncpy(tmp,(char *)(json_chunk + tok->start),__n);
    tmp[__n] = '\0';
    iVar2 = atoi(tmp);
    return iVar2;
  }
  return -1;
}

Assistant:

static int cgltf_json_to_int(jsmntok_t const* tok, const uint8_t* json_chunk)
{
	CGLTF_CHECK_TOKTYPE(*tok, JSMN_PRIMITIVE);
	char tmp[128];
	int size = (cgltf_size)(tok->end - tok->start) < sizeof(tmp) ? tok->end - tok->start : (int)(sizeof(tmp) - 1);
	strncpy(tmp, (const char*)json_chunk + tok->start, size);
	tmp[size] = 0;
	return CGLTF_ATOI(tmp);
}